

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singly_linked_list.cpp
# Opt level: O3

void si9ma::SinglyLinkedList::print_list(SinglyNodeWithRand *head,string *separator)

{
  ostream *poVar1;
  
  if (head != (SinglyNodeWithRand *)0x0) {
    do {
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,head->value);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,(separator->_M_dataplus)._M_p,separator->_M_string_length);
      head = head->next;
    } while (head != (SinglyNodeWithRand *)0x0);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  return;
}

Assistant:

void SinglyLinkedList::print_list(SinglyNodeWithRand *head,string separator) {
        while (head != nullptr){
            std::cout << head->value << separator;
            head = head->next;
        }

        std::cout << std::endl;
    }